

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O0

void __thiscall YAML::Scanner::ScanNextToken(Scanner *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  string *msg_;
  Stream *in_RDI;
  Mark MVar4;
  Scanner *unaff_retaddr;
  Scanner *in_stack_00000010;
  Scanner *in_stack_00000060;
  Scanner *in_stack_00000070;
  Scanner *in_stack_00000080;
  Scanner *in_stack_000000a0;
  Scanner *in_stack_000000c0;
  Scanner *in_stack_000000d0;
  Scanner *in_stack_00000100;
  Scanner *in_stack_00000120;
  Scanner *in_stack_00000130;
  Scanner *in_stack_000001d0;
  Stream *in_stack_ffffffffffffff68;
  allocator *paVar5;
  Scanner *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  Scanner *in_stack_ffffffffffffff80;
  allocator local_59;
  string local_58 [8];
  Scanner *in_stack_ffffffffffffffb0;
  
  if ((in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x39 & 1)
      == 0) {
    if ((in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x38 & 1
        ) == 0) {
      StartStream(in_stack_ffffffffffffffb0);
    }
    else {
      ScanToNextToken(in_stack_ffffffffffffffb0);
      PopIndentToHere(in_stack_ffffffffffffff80);
      bVar1 = YAML::Stream::operator!((Stream *)0xf15d45);
      if (bVar1) {
        EndStream(in_stack_ffffffffffffff70);
      }
      else {
        iVar3 = YAML::Stream::column(in_RDI);
        if ((iVar3 == 0) && (cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68), cVar2 == '%')) {
          ScanDirective(in_stack_000000c0);
        }
        else {
          iVar3 = YAML::Stream::column(in_RDI);
          if (iVar3 == 0) {
            Exp::DocStart();
            bVar1 = RegEx::Matches((RegEx *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
            if (bVar1) {
              ScanDocStart(unaff_retaddr);
              return;
            }
          }
          iVar3 = YAML::Stream::column(in_RDI);
          if (iVar3 == 0) {
            Exp::DocEnd();
            bVar1 = RegEx::Matches((RegEx *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
            if (bVar1) {
              ScanDocEnd(unaff_retaddr);
              return;
            }
          }
          cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68);
          if ((cVar2 == '[') ||
             (cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68), cVar2 == '{')) {
            ScanFlowStart(in_stack_00000010);
          }
          else {
            cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68);
            if ((cVar2 == ']') ||
               (cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68), cVar2 == '}')) {
              ScanFlowEnd(in_stack_00000130);
            }
            else {
              cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68);
              if (cVar2 == ',') {
                ScanFlowEntry(in_stack_00000080);
              }
              else {
                Exp::BlockEntry();
                bVar1 = RegEx::Matches((RegEx *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68)
                ;
                if (bVar1) {
                  ScanBlockEntry(in_stack_000000d0);
                }
                else {
                  bVar1 = InBlockContext((Scanner *)0xf15eae);
                  if (bVar1) {
                    Exp::Key();
                  }
                  else {
                    Exp::KeyInFlow();
                  }
                  bVar1 = RegEx::Matches((RegEx *)in_stack_ffffffffffffff70,
                                         in_stack_ffffffffffffff68);
                  if (bVar1) {
                    ScanKey(in_stack_00000060);
                  }
                  else {
                    GetValueRegex((Scanner *)
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
                    bVar1 = RegEx::Matches((RegEx *)in_stack_ffffffffffffff70,
                                           in_stack_ffffffffffffff68);
                    if (bVar1) {
                      ScanValue(in_stack_00000060);
                    }
                    else {
                      cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68);
                      if ((cVar2 == '*') ||
                         (cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68), cVar2 == '&')) {
                        ScanAnchorOrAlias(in_stack_00000120);
                      }
                      else {
                        cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68);
                        if (cVar2 == '!') {
                          ScanTag(in_stack_00000070);
                        }
                        else {
                          bVar1 = InBlockContext((Scanner *)0xf15f78);
                          if ((bVar1) &&
                             ((cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68), cVar2 == '|'
                              || (cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68),
                                 cVar2 == '>')))) {
                            ScanBlockScalar(in_stack_000001d0);
                          }
                          else {
                            cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68);
                            if ((cVar2 == '\'') ||
                               (cVar2 = YAML::Stream::peek(in_stack_ffffffffffffff68), cVar2 == '\"'
                               )) {
                              ScanQuotedScalar(in_stack_00000100);
                            }
                            else {
                              bVar1 = InBlockContext((Scanner *)0xf15fee);
                              if (bVar1) {
                                Exp::PlainScalar();
                              }
                              else {
                                Exp::PlainScalarInFlow();
                              }
                              bVar1 = RegEx::Matches((RegEx *)in_stack_ffffffffffffff70,
                                                     in_stack_ffffffffffffff68);
                              if (!bVar1) {
                                msg_ = (string *)__cxa_allocate_exception(0x40);
                                MVar4 = YAML::Stream::mark(in_RDI);
                                paVar5 = &local_59;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_58,"unknown token",paVar5);
                                ParserException::ParserException
                                          (MVar4._0_8_,
                                           (Mark *)CONCAT44(MVar4.column,in_stack_ffffffffffffff78),
                                           msg_);
                                __cxa_throw(msg_,&ParserException::typeinfo,
                                            ParserException::~ParserException);
                              }
                              ScanPlainScalar(in_stack_000000a0);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Scanner::ScanNextToken() {
  if (m_endedStream) {
    return;
  }

  if (!m_startedStream) {
    return StartStream();
  }

  // get rid of whitespace, etc. (in between tokens it should be irrelevant)
  ScanToNextToken();

  // maybe need to end some blocks
  PopIndentToHere();

  // *****
  // And now branch based on the next few characters!
  // *****

  // end of stream
  if (!INPUT) {
    return EndStream();
  }

  if (INPUT.column() == 0 && INPUT.peek() == Keys::Directive) {
    return ScanDirective();
  }

  // document token
  if (INPUT.column() == 0 && Exp::DocStart().Matches(INPUT)) {
    return ScanDocStart();
  }

  if (INPUT.column() == 0 && Exp::DocEnd().Matches(INPUT)) {
    return ScanDocEnd();
  }

  // flow start/end/entry
  if (INPUT.peek() == Keys::FlowSeqStart ||
      INPUT.peek() == Keys::FlowMapStart) {
    return ScanFlowStart();
  }

  if (INPUT.peek() == Keys::FlowSeqEnd || INPUT.peek() == Keys::FlowMapEnd) {
    return ScanFlowEnd();
  }

  if (INPUT.peek() == Keys::FlowEntry) {
    return ScanFlowEntry();
  }

  // block/map stuff
  if (Exp::BlockEntry().Matches(INPUT)) {
    return ScanBlockEntry();
  }

  if ((InBlockContext() ? Exp::Key() : Exp::KeyInFlow()).Matches(INPUT)) {
    return ScanKey();
  }

  if (GetValueRegex().Matches(INPUT)) {
    return ScanValue();
  }

  // alias/anchor
  if (INPUT.peek() == Keys::Alias || INPUT.peek() == Keys::Anchor) {
    return ScanAnchorOrAlias();
  }

  // tag
  if (INPUT.peek() == Keys::Tag) {
    return ScanTag();
  }

  // special scalars
  if (InBlockContext() && (INPUT.peek() == Keys::LiteralScalar ||
                           INPUT.peek() == Keys::FoldedScalar)) {
    return ScanBlockScalar();
  }

  if (INPUT.peek() == '\'' || INPUT.peek() == '\"') {
    return ScanQuotedScalar();
  }

  // plain scalars
  if ((InBlockContext() ? Exp::PlainScalar() : Exp::PlainScalarInFlow())
          .Matches(INPUT)) {
    return ScanPlainScalar();
  }

  // don't know what it is!
  throw ParserException(INPUT.mark(), ErrorMsg::UNKNOWN_TOKEN);
}